

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::QuadLight>::transform
          (LightNodeImpl<embree::SceneGraph::QuadLight> *this,AffineSpace3fa *space)

{
  _func_int **pp_Var1;
  LightNodeImpl<embree::SceneGraph::QuadLight> *in_RDI;
  LightNodeImpl<embree::SceneGraph::QuadLight> *this_00;
  AffineSpace3fa *in_stack_ffffffffffffff88;
  QuadLight *in_stack_ffffffffffffff90;
  
  this_00 = in_RDI;
  pp_Var1 = (_func_int **)operator_new(0x3cff73);
  QuadLight::transform(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  LightNodeImpl(this_00,(QuadLight *)in_RDI);
  (in_RDI->super_LightNode).super_Node.super_RefCount._vptr_RefCount = pp_Var1;
  if ((in_RDI->super_LightNode).super_Node.super_RefCount._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_LightNode).super_Node.super_RefCount._vptr_RefCount + 0x10))();
  }
  return (Ref<embree::SceneGraph::LightNode>)&this_00->super_LightNode;
}

Assistant:

virtual Ref<LightNode> transform(const AffineSpace3fa& space) const {
        return new LightNodeImpl(light.transform(space));
      }